

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_openssl.c
# Opt level: O3

int x509_openssl_add_credentials
              (SSL_CTX *ssl_ctx,char *x509certificate,char *x509privatekey,
              OPTION_OPENSSL_KEY_TYPE x509privatekeytype,ENGINE *engine)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  BIO *bp;
  X509 *x;
  X509 *a;
  long lVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  
  if ((x509certificate == (char *)0x0 || ssl_ctx == (SSL_CTX *)0x0) || x509privatekey == (char *)0x0
     ) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x12a;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/x509_openssl.c"
              ,"x509_openssl_add_credentials",0x129,1,
              "invalid parameter detected: ssl_ctx=%p, x509certificate=%p, x509privatekey=%p",
              ssl_ctx,x509certificate,x509privatekey);
    return 0x12a;
  }
  if (engine == (ENGINE *)0x0 && x509privatekeytype == KEY_TYPE_ENGINE) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x130;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x130;
    }
    pcVar6 = "OpenSSL Engine must be configured when KEY_TYPE_ENGINE is used.";
    iVar5 = 0x12f;
  }
  else {
    if (x509privatekeytype == KEY_TYPE_DEFAULT) {
      iVar1 = x509_openssl_add_pem_file_key(ssl_ctx,x509privatekey);
    }
    else {
      if (x509privatekeytype != KEY_TYPE_ENGINE) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0x143;
        }
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/x509_openssl.c"
                  ,"x509_openssl_add_credentials",0x142,1,
                  "Unexpected value of OPTION_OPENSSL_KEY_TYPE (%d)",(ulong)x509privatekeytype);
        return 0x143;
      }
      iVar1 = x509_openssl_add_engine_key(ssl_ctx,x509privatekey,engine);
    }
    if (iVar1 != 0) {
      return iVar1;
    }
    bp = BIO_new_mem_buf(x509certificate,-1);
    if (bp == (BIO *)0x0) {
      log_ERR_get_error("cannot create BIO");
    }
    else {
      x = PEM_read_bio_X509_AUX(bp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
      if (x == (X509 *)0x0) {
        log_ERR_get_error("Failure PEM_read_bio_X509_AUX");
      }
      else {
        iVar1 = SSL_CTX_use_certificate((SSL_CTX *)ssl_ctx,x);
        if (iVar1 == 1) {
          SSL_CTX_ctrl((SSL_CTX *)ssl_ctx,0x53,0,(void *)0x0);
          do {
            a = PEM_read_bio_X509(bp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
            if (a == (X509 *)0x0) goto LAB_0016c1a2;
            lVar3 = SSL_CTX_ctrl((SSL_CTX *)ssl_ctx,0xe,0,a);
          } while (lVar3 == 1);
          X509_free(a);
          uVar4 = ERR_peek_last_error();
          if ((int)uVar4 == 0x480006c) {
            ERR_clear_error();
LAB_0016c1a2:
            X509_free(x);
            BIO_free(bp);
            return 0;
          }
        }
        else {
          log_ERR_get_error("Failure PEM_read_bio_X509_AUX");
        }
        X509_free(x);
      }
      BIO_free(bp);
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x14b;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x14b;
    }
    pcVar6 = "failure loading public cert or chain";
    iVar5 = 0x14a;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/x509_openssl.c"
            ,"x509_openssl_add_credentials",iVar5,1,pcVar6);
  return iVar1;
}

Assistant:

int x509_openssl_add_credentials(
    SSL_CTX* ssl_ctx,
    const char* x509certificate,
    const char* x509privatekey,
    OPTION_OPENSSL_KEY_TYPE x509privatekeytype)
#endif // OPENSSL_NO_ENGINE
{
    int result;
    if (ssl_ctx == NULL || x509certificate == NULL || x509privatekey == NULL)
    {
        /*Codes_SRS_X509_OPENSSL_02_009: [ Otherwise x509_openssl_add_credentials shall fail and return a non-zero number. ]*/
        LogError("invalid parameter detected: ssl_ctx=%p, x509certificate=%p, x509privatekey=%p", ssl_ctx, x509certificate, x509privatekey);
        result = MU_FAILURE;
    }
#ifndef OPENSSL_NO_ENGINE
    else if ((x509privatekeytype == KEY_TYPE_ENGINE) && (engine == NULL))
    {
        LogError("OpenSSL Engine must be configured when KEY_TYPE_ENGINE is used.");
        result = MU_FAILURE;
    }
#endif // OPENSSL_NO_ENGINE
    else
    {
        // Configure private key.
        if (x509privatekeytype == KEY_TYPE_DEFAULT)
        {
            result = x509_openssl_add_pem_file_key(ssl_ctx, x509privatekey);
        }
        #ifndef OPENSSL_NO_ENGINE
        else if (x509privatekeytype == KEY_TYPE_ENGINE)
        {
            result = x509_openssl_add_engine_key(ssl_ctx, x509privatekey, engine);
        }
        #endif // OPENSSL_NO_ENGINE
        else
        {
            LogError("Unexpected value of OPTION_OPENSSL_KEY_TYPE (%d)", x509privatekeytype);
            result = MU_FAILURE;
        }

        if (result == 0)
        {
            if (load_certificate_chain(ssl_ctx, x509certificate) != 0)
            {
                LogError("failure loading public cert or chain");
                result = MU_FAILURE;
            }
        }
    }

    return result;
}